

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O3

void __thiscall
Cgmres<Model>::init_u0_newton(Cgmres<Model> *this,double *u0,double *x0,double *p0,uint16_t n_loop)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  undefined6 in_register_00000082;
  uint16_t uVar8;
  double dVar9;
  double dVar10;
  double mat [36];
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188 [43];
  
  local_1a8 = (*p0 - *x0) * -10.0;
  dStack_1a0 = (p0[1] - x0[1]) * -10.0;
  local_198 = x0[2];
  dStack_190 = x0[3];
  if ((int)CONCAT62(in_register_00000082,n_loop) != 0) {
    uVar8 = 0;
    do {
      dVar1 = *u0;
      dVar2 = u0[1];
      dVar9 = u0[4] + u0[4];
      dVar10 = u0[5] + u0[5];
      local_188[0] = dVar9 * dVar1 + dVar1 * 0.1 + local_198;
      local_188[1] = dVar10 * dVar2 + dVar2 * 0.1 + dStack_190;
      dVar3 = u0[2];
      dVar4 = u0[3];
      local_188[2] = dVar9 * dVar3 + -0.01;
      local_188[3] = dVar10 * dVar4 + -0.01;
      local_188[4] = dVar1 * dVar1 + dVar3 * dVar3 + -100.0;
      local_188[5] = dVar2 * dVar2 + dVar4 * dVar4 + -100.0;
      Model::ddHduu(local_188 + 6,x0,u0,p0,&local_1a8);
      linsolve(local_188,local_188 + 6,6);
      lVar5 = 0;
      do {
        dVar1 = (u0 + lVar5)[1];
        dVar2 = local_188[lVar5 + 1];
        u0[lVar5] = u0[lVar5] - local_188[lVar5];
        (u0 + lVar5)[1] = dVar1 - dVar2;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 6);
      uVar8 = uVar8 + 1;
    } while (uVar8 != n_loop);
  }
  pdVar6 = this->U;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      pdVar6[lVar7] = u0[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    lVar5 = lVar5 + 1;
    pdVar6 = pdVar6 + 6;
  } while (lVar5 != 0x32);
  return;
}

Assistant:

void init_u0_newton(double* u0, const double* x0, const double* p0, const uint16_t n_loop) {
    double lmd0[dim_x], vec[dim_u], mat[dim_u * dim_u];

    Model::dPhidx(lmd0, x0, p0);

    // u0 = u0 - dHduu \ dHdu
    for (uint16_t i = 0; i < n_loop; i++) {
      Model::dHdu(vec, x0, u0, p0, lmd0);
      Model::ddHduu(mat, x0, u0, p0, lmd0);
      linsolve(vec, mat, dim_u);

      sub(u0, u0, vec, dim_u);
    }

    init_u0(u0);
  }